

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CAPSFile.cpp
# Opt level: O0

void __thiscall CAPSFile::~CAPSFile(CAPSFile *this)

{
  CAPSFile *this_local;
  
  this->_vptr_CAPSFile = (_func_int **)&PTR__CAPSFile_0022cd60;
  Clear(this);
  std::vector<CAPSFile::Trackchunk,_std::allocator<CAPSFile::Trackchunk>_>::~vector
            (&this->list_tracks_);
  std::vector<CAPSFile::DataChunks,_std::allocator<CAPSFile::DataChunks>_>::~vector
            (&this->list_data_);
  std::vector<CAPSFile::ImgeItem,_std::allocator<CAPSFile::ImgeItem>_>::~vector(&this->list_imge_);
  return;
}

Assistant:

CAPSFile::~CAPSFile()
{
   CAPSFile::Clear();
}